

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O0

Proto * luaU_undump(lua_State *L,ZIO *Z,Mbuffer *buff,char *name)

{
  TString *p;
  Proto *pPVar1;
  undefined1 local_48 [8];
  LoadState S;
  char *name_local;
  Mbuffer *buff_local;
  ZIO *Z_local;
  lua_State *L_local;
  
  if ((*name == '@') || (*name == '=')) {
    S.b = (Mbuffer *)(name + 1);
  }
  else {
    S.b = (Mbuffer *)name;
    if (*name == '\x1b') {
      S.b = (Mbuffer *)anon_var_dwarf_2189d;
    }
  }
  local_48 = (undefined1  [8])L;
  S.L = (lua_State *)Z;
  S.Z = (ZIO *)buff;
  S.name = name;
  LoadHeader((LoadState *)local_48);
  p = luaS_newlstr(L,"=?",2);
  pPVar1 = LoadFunction((LoadState *)local_48,p);
  return pPVar1;
}

Assistant:

Proto* luaU_undump (lua_State* L, ZIO* Z, Mbuffer* buff, const char* name)
{
 LoadState S;
 if (*name=='@' || *name=='=')
  S.name=name+1;
 else if (*name==LUA_SIGNATURE[0])
  S.name="binary string";
 else
  S.name=name;
 S.L=L;
 S.Z=Z;
 S.b=buff;
 LoadHeader(&S);
 return LoadFunction(&S,luaS_newliteral(L,"=?"));
}